

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysp_node_action ** lysp_node_actions_p(lysp_node *node)

{
  uint16_t uVar1;
  lysp_node *node_local;
  
  if (node != (lysp_node *)0x0) {
    uVar1 = node->nodetype;
    if (uVar1 == 1) {
      node_local = (lysp_node *)&node[1].iffeatures;
    }
    else if (uVar1 == 0x10) {
      node_local = (lysp_node *)&node[1].iffeatures;
    }
    else if (uVar1 == 0x4000) {
      node_local = (lysp_node *)&node[1].name;
    }
    else if (uVar1 == 0x8000) {
      node_local = (lysp_node *)&node[1].next;
    }
    else {
      node_local = (lysp_node *)0x0;
    }
    return (lysp_node_action **)node_local;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                ,0x595,"struct lysp_node_action **lysp_node_actions_p(struct lysp_node *)");
}

Assistant:

struct lysp_node_action **
lysp_node_actions_p(struct lysp_node *node)
{
    assert(node);

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysp_node_container *)node)->actions;
    case LYS_LIST:
        return &((struct lysp_node_list *)node)->actions;
    case LYS_GROUPING:
        return &((struct lysp_node_grp *)node)->actions;
    case LYS_AUGMENT:
        return &((struct lysp_node_augment *)node)->actions;
    default:
        return NULL;
    }
}